

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_transaction.cpp
# Opt level: O0

void __thiscall
cfdcapi_transaction_UpdateTxInSequence_Test::TestBody
          (cfdcapi_transaction_UpdateTxInSequence_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  char *pcVar3;
  char *in_R9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  char *str_buffer;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar_3;
  char *tx_hex;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_1;
  void *tx_handle;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  bool *in_stack_fffffffffffffc88;
  AssertionResult *in_stack_fffffffffffffc90;
  AssertionResult *pAVar4;
  undefined7 in_stack_fffffffffffffc98;
  undefined1 in_stack_fffffffffffffc9f;
  char *in_stack_fffffffffffffca0;
  AssertionResult *in_stack_fffffffffffffca8;
  undefined7 in_stack_fffffffffffffcc8;
  undefined1 in_stack_fffffffffffffccf;
  undefined7 in_stack_fffffffffffffd20;
  undefined1 in_stack_fffffffffffffd27;
  char *in_stack_fffffffffffffd28;
  undefined7 in_stack_fffffffffffffd60;
  AssertHelper local_270;
  Message local_268;
  undefined4 local_25c;
  AssertionResult local_258;
  AssertHelper local_248;
  Message local_240;
  AssertionResult local_238;
  AssertHelper local_228;
  Message local_220;
  undefined4 local_214;
  AssertionResult local_210;
  char *local_200;
  AssertHelper local_1f8;
  uint32_t in_stack_fffffffffffffe10;
  uint32_t in_stack_fffffffffffffe14;
  undefined4 in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe1c;
  void *in_stack_fffffffffffffe20;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe28;
  AssertHelper local_1d0;
  Message local_1c8;
  AssertionResult local_1c0;
  void **in_stack_fffffffffffffe50;
  char *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe64;
  undefined8 in_stack_fffffffffffffe68;
  AssertHelper local_190;
  Message local_188;
  undefined1 local_179;
  AssertionResult local_178;
  AssertHelper local_168;
  Message local_160;
  undefined4 local_154;
  AssertionResult local_150;
  char *local_140;
  AssertHelper local_138;
  Message local_130;
  undefined4 local_124;
  AssertionResult local_120;
  string local_110;
  AssertHelper local_f0;
  Message local_e8;
  undefined1 local_d9;
  AssertionResult local_d8;
  AssertHelper local_c8;
  Message local_c0;
  undefined4 local_b4;
  AssertionResult local_b0;
  long local_a0;
  string local_98;
  AssertHelper local_78;
  Message local_70;
  undefined1 local_61;
  AssertionResult local_60;
  AssertHelper local_50;
  Message local_48 [3];
  undefined4 local_2c;
  AssertionResult local_28;
  int local_14;
  long local_10;
  
  local_10 = 0;
  local_14 = CfdCreateHandle((void **)in_stack_fffffffffffffca8);
  local_2c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            (&in_stack_fffffffffffffca8->success_,in_stack_fffffffffffffca0,
             (CfdErrorCode *)CONCAT17(in_stack_fffffffffffffc9f,in_stack_fffffffffffffc98),
             (int *)in_stack_fffffffffffffc90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message(local_48);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3c98ba);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x3d3,pcVar3);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message((Message *)0x3c991d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c9972);
  local_61 = local_10 != 0;
  pAVar4 = &local_60;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,(type *)0x3c99a6);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&local_60,(AssertionResult *)"(nullptr == handle)","true",
               "false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x3d4,pcVar3);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    testing::Message::~Message((Message *)0x3c9aa2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c9b1d);
  local_a0 = 0;
  local_14 = CfdInitializeTxDataHandle
                       ((void *)in_stack_fffffffffffffe68,in_stack_fffffffffffffe64,
                        in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  local_b4 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            (&in_stack_fffffffffffffca8->success_,in_stack_fffffffffffffca0,
             (CfdErrorCode *)CONCAT17(in_stack_fffffffffffffc9f,in_stack_fffffffffffffc98),
             (int *)in_stack_fffffffffffffc90);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(&local_b0);
  if (!(bool)uVar2) {
    testing::Message::Message(&local_c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3c9bfb);
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x3d9,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::Message::~Message((Message *)0x3c9c5e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c9cb3);
  local_d9 = local_a0 != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,(type *)0x3c9ce7);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_d8);
  if (!bVar1) {
    testing::Message::Message(&local_e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_110,(internal *)&local_d8,(AssertionResult *)"(nullptr == tx_handle)","true",
               "false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x3da,pcVar3);
    testing::internal::AssertHelper::operator=(&local_f0,&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    testing::Message::~Message((Message *)0x3c9de3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c9e5e);
  if (local_14 == 0) {
    local_14 = CfdUpdateTxInSequence
                         (in_stack_fffffffffffffe28.ptr_,in_stack_fffffffffffffe20,
                          (char *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                          in_stack_fffffffffffffe14,in_stack_fffffffffffffe10);
    local_124 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              (&in_stack_fffffffffffffca8->success_,in_stack_fffffffffffffca0,
               (CfdErrorCode *)CONCAT17(in_stack_fffffffffffffc9f,in_stack_fffffffffffffc98),
               (int *)in_stack_fffffffffffffc90);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_120);
    if (!bVar1) {
      testing::Message::Message(&local_130);
      in_stack_fffffffffffffd28 =
           testing::AssertionResult::failure_message((AssertionResult *)0x3c9f44);
      testing::internal::AssertHelper::AssertHelper
                (&local_138,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x3dd,in_stack_fffffffffffffd28);
      testing::internal::AssertHelper::operator=(&local_138,&local_130);
      testing::internal::AssertHelper::~AssertHelper(&local_138);
      testing::Message::~Message((Message *)0x3c9fa7);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c9fff);
    local_140 = (char *)0x0;
    local_14 = CfdFinalizeTransaction
                         (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,(char **)0x3ca028);
    local_154 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              (&in_stack_fffffffffffffca8->success_,in_stack_fffffffffffffca0,
               (CfdErrorCode *)CONCAT17(in_stack_fffffffffffffc9f,in_stack_fffffffffffffc98),
               (int *)in_stack_fffffffffffffc90);
    in_stack_fffffffffffffd27 = testing::AssertionResult::operator_cast_to_bool(&local_150);
    if (!(bool)in_stack_fffffffffffffd27) {
      testing::Message::Message(&local_160);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3ca0dc);
      testing::internal::AssertHelper::AssertHelper
                (&local_168,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x3e1,pcVar3);
      testing::internal::AssertHelper::operator=(&local_168,&local_160);
      testing::internal::AssertHelper::~AssertHelper(&local_168);
      testing::Message::~Message((Message *)0x3ca13f);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3ca194);
    local_179 = local_140 != (char *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,(type *)0x3ca1c5);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_178);
    if (!bVar1) {
      testing::Message::Message(&local_188);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&stack0xfffffffffffffe50,(internal *)&local_178,
                 (AssertionResult *)"(nullptr == tx_hex)","true","false",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_190,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x3e2,pcVar3);
      testing::internal::AssertHelper::operator=(&local_190,&local_188);
      testing::internal::AssertHelper::~AssertHelper(&local_190);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffe50);
      testing::Message::~Message((Message *)0x3ca2be);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3ca336);
    if (local_140 != (char *)0x0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_1c0,
                 "\"02000000000102a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a47304402205d038d82d3d7043f21b9b3d0e3ea85225ffcb78d02b8531cb1ddbec7e577e7460220367c0b985b1bb76de1f95ce4696ad9717f28ed6a356765cf31a894c42f3bb81201210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcafeffffff02706f9800000000001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac20bf02000000000016001445663e592ff613587f0fdd6e74034c5239710dca00024730440220572c4f56643d35a229bf632810ee947190414285b790e841f9e664dfd8e1f25d022021d8e4b01c08ad50bf3f1b6edfb25bb9dc8640b36dce1e26bff352097068d07f01210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a2700000000\""
                 ,"tx_hex",
                 "02000000000102a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a47304402205d038d82d3d7043f21b9b3d0e3ea85225ffcb78d02b8531cb1ddbec7e577e7460220367c0b985b1bb76de1f95ce4696ad9717f28ed6a356765cf31a894c42f3bb81201210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcafeffffff02706f9800000000001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac20bf02000000000016001445663e592ff613587f0fdd6e74034c5239710dca00024730440220572c4f56643d35a229bf632810ee947190414285b790e841f9e664dfd8e1f25d022021d8e4b01c08ad50bf3f1b6edfb25bb9dc8640b36dce1e26bff352097068d07f01210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a2700000000"
                 ,local_140);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1c0);
      if (!bVar1) {
        testing::Message::Message(&local_1c8);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3ca3da);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1d0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0x3e4,pcVar3);
        testing::internal::AssertHelper::operator=(&local_1d0,&local_1c8);
        testing::internal::AssertHelper::~AssertHelper(&local_1d0);
        testing::Message::~Message((Message *)0x3ca437);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3ca48c);
      CfdFreeStringBuffer((char *)CONCAT17(in_stack_fffffffffffffc9f,in_stack_fffffffffffffc98));
    }
    local_14 = CfdFreeTxDataHandle(pAVar4,(void *)CONCAT17(uVar2,in_stack_fffffffffffffd60));
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              (&in_stack_fffffffffffffca8->success_,in_stack_fffffffffffffca0,
               (CfdErrorCode *)CONCAT17(in_stack_fffffffffffffc9f,in_stack_fffffffffffffc98),
               (int *)in_stack_fffffffffffffc90);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffffe20);
    if (!bVar1) {
      testing::Message::Message((Message *)&stack0xfffffffffffffe10);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3ca558);
      testing::internal::AssertHelper::AssertHelper
                (&local_1f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x3e9,pcVar3);
      testing::internal::AssertHelper::operator=(&local_1f8,(Message *)&stack0xfffffffffffffe10);
      testing::internal::AssertHelper::~AssertHelper(&local_1f8);
      testing::Message::~Message((Message *)0x3ca5b5);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3ca60a);
  }
  local_14 = CfdGetLastErrorCode((void *)CONCAT17(in_stack_fffffffffffffccf,
                                                  in_stack_fffffffffffffcc8));
  if (local_14 != 0) {
    local_200 = (char *)0x0;
    local_14 = CfdGetLastErrorMessage
                         (in_stack_fffffffffffffd28,
                          (char **)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20));
    local_214 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              (&in_stack_fffffffffffffca8->success_,in_stack_fffffffffffffca0,
               (CfdErrorCode *)CONCAT17(in_stack_fffffffffffffc9f,in_stack_fffffffffffffc98),
               (int *)in_stack_fffffffffffffc90);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_210);
    if (!bVar1) {
      testing::Message::Message(&local_220);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3ca6f7);
      testing::internal::AssertHelper::AssertHelper
                (&local_228,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x3f0,pcVar3);
      testing::internal::AssertHelper::operator=(&local_228,&local_220);
      testing::internal::AssertHelper::~AssertHelper(&local_228);
      testing::Message::~Message((Message *)0x3ca754);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3ca7a9);
    in_stack_fffffffffffffca8 = &local_238;
    testing::internal::CmpHelperSTREQ
              ((internal *)in_stack_fffffffffffffca8,"\"\"","str_buffer","",local_200);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffffca8);
    if (!bVar1) {
      testing::Message::Message(&local_240);
      in_stack_fffffffffffffca0 =
           testing::AssertionResult::failure_message((AssertionResult *)0x3ca83e);
      testing::internal::AssertHelper::AssertHelper
                (&local_248,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x3f1,in_stack_fffffffffffffca0);
      testing::internal::AssertHelper::operator=(&local_248,&local_240);
      testing::internal::AssertHelper::~AssertHelper(&local_248);
      testing::Message::~Message((Message *)0x3ca89b);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3ca8f0);
    CfdFreeStringBuffer((char *)CONCAT17(in_stack_fffffffffffffc9f,in_stack_fffffffffffffc98));
    local_200 = (char *)0x0;
  }
  local_14 = CfdFreeHandle((void *)CONCAT17(in_stack_fffffffffffffc9f,in_stack_fffffffffffffc98));
  local_25c = 0;
  pAVar4 = &local_258;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            (&in_stack_fffffffffffffca8->success_,in_stack_fffffffffffffca0,
             (CfdErrorCode *)CONCAT17(in_stack_fffffffffffffc9f,in_stack_fffffffffffffc98),
             (int *)pAVar4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
  if (!bVar1) {
    testing::Message::Message(&local_268);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3ca9c0);
    testing::internal::AssertHelper::AssertHelper
              (&local_270,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x3f7,pcVar3);
    testing::internal::AssertHelper::operator=(&local_270,&local_268);
    testing::internal::AssertHelper::~AssertHelper(&local_270);
    testing::Message::~Message((Message *)0x3caa1b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3caa70);
  return;
}

Assistant:

TEST(cfdcapi_transaction, UpdateTxInSequence) {
  static const char* const kTxHex = "02000000000102a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a47304402205d038d82d3d7043f21b9b3d0e3ea85225ffcb78d02b8531cb1ddbec7e577e7460220367c0b985b1bb76de1f95ce4696ad9717f28ed6a356765cf31a894c42f3bb81201210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffff02706f9800000000001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac20bf02000000000016001445663e592ff613587f0fdd6e74034c5239710dca00024730440220572c4f56643d35a229bf632810ee947190414285b790e841f9e664dfd8e1f25d022021d8e4b01c08ad50bf3f1b6edfb25bb9dc8640b36dce1e26bff352097068d07f01210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a2700000000";
  static const char* const kTxid = "31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3";
  static const uint32_t kVout = 0;

  void* handle = nullptr;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((nullptr == handle));

  void* tx_handle = nullptr;
  ret = CfdInitializeTxDataHandle(
      handle, kCfdNetworkMainnet, kTxHex, &tx_handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((nullptr == tx_handle));
  if (ret == kCfdSuccess) {
    ret = CfdUpdateTxInSequence(handle, tx_handle, kTxid, kVout, 4294967294);
    EXPECT_EQ(kCfdSuccess, ret);

    char* tx_hex = nullptr;
    ret = CfdFinalizeTransaction(handle, tx_handle, &tx_hex);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_FALSE((nullptr == tx_hex));
    if (tx_hex != nullptr) {
      EXPECT_STREQ("02000000000102a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a47304402205d038d82d3d7043f21b9b3d0e3ea85225ffcb78d02b8531cb1ddbec7e577e7460220367c0b985b1bb76de1f95ce4696ad9717f28ed6a356765cf31a894c42f3bb81201210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcafeffffff02706f9800000000001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac20bf02000000000016001445663e592ff613587f0fdd6e74034c5239710dca00024730440220572c4f56643d35a229bf632810ee947190414285b790e841f9e664dfd8e1f25d022021d8e4b01c08ad50bf3f1b6edfb25bb9dc8640b36dce1e26bff352097068d07f01210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a2700000000", tx_hex);
      CfdFreeStringBuffer(tx_hex);
    }

    ret = CfdFreeTxDataHandle(handle, tx_handle);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = nullptr;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = nullptr;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}